

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_tet(tetgenio *this,char *filebasename)

{
  int iVar1;
  tetgenio *ptVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  long lVar6;
  int *piVar7;
  int *piVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  undefined4 *puVar12;
  int *in_RCX;
  int iVar13;
  char *this_00;
  tetgenio *ptVar14;
  bool bVar15;
  long lVar16;
  double dVar17;
  char infilename [1024];
  char inputline [2048];
  tetgenio *local_c50;
  int local_c44;
  FILE *local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1020];
  char local_838 [2056];
  
  strcpy(local_c38,filebasename);
  sVar5 = strlen(local_c38);
  builtin_strncpy(local_c38 + sVar5,".ele",4);
  auStack_c34[sVar5] = 0;
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    bVar15 = false;
  }
  else {
    this_00 = "Opening %s.\n";
    printf("Opening %s.\n",local_c38);
    local_c50 = (tetgenio *)
                readnumberline((tetgenio *)this_00,local_838,(FILE *)__stream,(char *)in_RCX);
    lVar6 = strtol((char *)local_c50,(char **)&local_c50,0);
    this->numberoftetrahedra = (int)lVar6;
    ptVar14 = local_c50;
    if ((int)lVar6 < 1) {
      puts("Error:  Invalid number of tetrahedra.");
      bVar15 = false;
    }
    else {
      while ((piVar8 = (int *)(ulong)(byte)ptVar14->firstnumber, (int *)0x2c < piVar8 ||
             ((0x100900000201U >> ((ulong)piVar8 & 0x3f) & 1) == 0))) {
        ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
      }
      for (; bVar3 = (byte)piVar8, local_c50 = ptVar14, 0x2e < bVar3;
          piVar8 = (int *)(ulong)*(byte *)((long)piVar8 + 1)) {
LAB_0010e7e9:
        piVar8 = in_RCX;
        if (0xf5 < (byte)(bVar3 - 0x3a)) goto LAB_0010e838;
        piVar8 = &ptVar14->firstnumber;
        ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
      }
      if ((0x680000000001U >> ((ulong)piVar8 & 0x3f) & 1) == 0) {
        in_RCX = piVar8;
        if (piVar8 != (int *)0x23) goto LAB_0010e7e9;
        *(char *)&ptVar14->firstnumber = '\0';
LAB_0010e826:
        this->numberofcorners = 4;
        goto LAB_0010e856;
      }
      if (bVar3 == 0) goto LAB_0010e826;
LAB_0010e838:
      lVar6 = strtol((char *)ptVar14,(char **)&local_c50,0);
      this->numberofcorners = (int)lVar6;
      ptVar14 = local_c50;
LAB_0010e856:
      while ((piVar7 = (int *)(ulong)(byte)ptVar14->firstnumber, (int *)0x2c < piVar7 ||
             ((0x100900000201U >> ((ulong)piVar7 & 0x3f) & 1) == 0))) {
        ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
      }
      for (; bVar3 = (byte)piVar7, 0x2e < bVar3; piVar7 = (int *)(ulong)*(byte *)((long)piVar7 + 1))
      {
LAB_0010e86d:
        piVar7 = piVar8;
        if (0xf5 < (byte)(bVar3 - 0x3a)) goto LAB_0010e89e;
        piVar7 = &ptVar14->firstnumber;
        ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
      }
      if ((0x680000000001U >> ((ulong)piVar7 & 0x3f) & 1) == 0) {
        piVar8 = piVar7;
        if (piVar7 != (int *)0x23) goto LAB_0010e86d;
        *(char *)&ptVar14->firstnumber = '\0';
LAB_0010e894:
        iVar13 = 0;
        goto LAB_0010e8ad;
      }
      local_c50 = ptVar14;
      if (bVar3 == 0) goto LAB_0010e894;
LAB_0010e89e:
      local_c50 = ptVar14;
      lVar6 = strtol((char *)ptVar14,(char **)&local_c50,0);
      iVar13 = (int)lVar6;
LAB_0010e8ad:
      this->numberoftetrahedronattributes = iVar13;
      iVar1 = this->numberofcorners;
      if ((iVar1 == 4) || (iVar1 == 10)) {
        iVar4 = this->numberoftetrahedra;
        ptVar14 = (tetgenio *)((long)(iVar1 * iVar4) * 4);
        if (iVar1 * iVar4 < 0) {
          ptVar14 = (tetgenio *)0xffffffffffffffff;
        }
        local_c40 = __stream;
        piVar8 = (int *)operator_new__((ulong)ptVar14);
        this->tetrahedronlist = piVar8;
        if (0 < iVar13) {
          ptVar14 = (tetgenio *)((long)(iVar13 * iVar4) * 8);
          if (iVar13 * iVar4 < 0) {
            ptVar14 = (tetgenio *)0xffffffffffffffff;
          }
          pdVar9 = (double *)operator_new__((ulong)ptVar14);
          this->tetrahedronattributelist = pdVar9;
        }
        bVar15 = true;
        __stream = local_c40;
        if (0 < iVar4) {
          iVar13 = 0;
          lVar16 = 0;
          lVar6 = 0;
          do {
            local_c44 = iVar13;
            local_c50 = (tetgenio *)
                        readnumberline(ptVar14,local_838,(FILE *)local_c40,(char *)piVar7);
            if (0 < this->numberofcorners) {
              lVar6 = (long)(int)lVar6;
              iVar13 = 0;
              ptVar2 = local_c50;
              do {
                while ((ptVar14 = ptVar2, uVar10 = (ulong)(byte)ptVar14->firstnumber, 0x2c < uVar10
                       || ((0x100900000201U >> (uVar10 & 0x3f) & 1) == 0))) {
                  ptVar2 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
                }
                while (bVar3 = (byte)uVar10, 0x2e < bVar3) {
LAB_0010e993:
                  if (0xf5 < (byte)(bVar3 - 0x3a)) goto LAB_0010e9ad;
                  piVar8 = &ptVar14->firstnumber;
                  ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
                  uVar10 = (ulong)*(byte *)((long)piVar8 + 1);
                }
                if ((0x680000000001U >> (uVar10 & 0x3f) & 1) == 0) {
                  if (uVar10 != 0x23) goto LAB_0010e993;
                  *(undefined1 *)&ptVar14->firstnumber = 0;
LAB_0010eac7:
                  printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
                         (ulong)(uint)(local_c44 + this->firstnumber),(ulong)(iVar13 + 1),local_c38)
                  ;
                  goto LAB_0010eaf9;
                }
                local_c50 = ptVar14;
                if (bVar3 == 0) goto LAB_0010eac7;
LAB_0010e9ad:
                local_c50 = ptVar14;
                lVar11 = strtol((char *)ptVar14,(char **)&local_c50,0);
                iVar1 = this->firstnumber;
                iVar4 = (int)lVar11;
                if ((iVar4 < iVar1) || (this->numberofpoints + iVar1 <= iVar4)) {
                  printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
                         (ulong)(uint)(iVar1 + local_c44));
LAB_0010eaf9:
                  puVar12 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar12 = 1;
                  __cxa_throw(puVar12,&int::typeinfo,0);
                }
                piVar7 = this->tetrahedronlist;
                piVar7[lVar6] = iVar4;
                lVar6 = lVar6 + 1;
                iVar13 = iVar13 + 1;
                ptVar2 = local_c50;
              } while (iVar13 < this->numberofcorners);
            }
            if (0 < this->numberoftetrahedronattributes) {
              lVar16 = (long)(int)lVar16;
              iVar13 = 0;
              piVar8 = piVar7;
              do {
                while ((ptVar14 = local_c50, piVar7 = (int *)(ulong)(byte)ptVar14->firstnumber,
                       (int *)0x2c < piVar7 ||
                       ((0x100900000201U >> ((ulong)piVar7 & 0x3f) & 1) == 0))) {
                  local_c50 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
                }
                for (; bVar3 = (byte)piVar7, local_c50 = ptVar14, 0x2e < bVar3;
                    piVar7 = (int *)(ulong)*(byte *)((long)piVar7 + 1)) {
LAB_0010ea2d:
                  piVar7 = piVar8;
                  if (0xf5 < (byte)(bVar3 - 0x3a)) goto LAB_0010ea43;
                  piVar7 = &ptVar14->firstnumber;
                  ptVar14 = (tetgenio *)((long)&ptVar14->firstnumber + 1);
                }
                if ((0x680000000001U >> ((ulong)piVar7 & 0x3f) & 1) == 0) {
                  piVar8 = piVar7;
                  if (piVar7 != (int *)0x23) goto LAB_0010ea2d;
                  *(undefined1 *)&ptVar14->firstnumber = 0;
LAB_0010ea57:
                  dVar17 = 0.0;
                  goto LAB_0010ea5a;
                }
                if (bVar3 == 0) goto LAB_0010ea57;
LAB_0010ea43:
                dVar17 = strtod((char *)ptVar14,(char **)&local_c50);
LAB_0010ea5a:
                this->tetrahedronattributelist[lVar16] = dVar17;
                lVar16 = lVar16 + 1;
                iVar13 = iVar13 + 1;
                piVar8 = piVar7;
              } while (iVar13 < this->numberoftetrahedronattributes);
            }
            iVar13 = local_c44 + 1;
          } while (iVar13 < this->numberoftetrahedra);
          bVar15 = true;
          __stream = local_c40;
        }
      }
      else {
        bVar15 = false;
        printf("Error:  Wrong number of corners %d (should be 4 or 10).\n");
      }
    }
    fclose(__stream);
  }
  return bVar15;
}

Assistant:

bool tetgenio::load_tet(char* filebasename)
{
  FILE *infile;
  char infilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL attrib;
  int corner;
  int index, attribindex;
  int i, j;

  strcpy(infilename, filebasename);
  strcat(infilename, ".ele");

  infile = fopen(infilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", infilename);
  } else {
    return false;
  }

  // Read number of elements, number of corners (4 or 10), number of
  //   element attributes.
  stringptr = readnumberline(inputline, infile, infilename);
  numberoftetrahedra = (int) strtol (stringptr, &stringptr, 0);
  if (numberoftetrahedra <= 0) {
    printf("Error:  Invalid number of tetrahedra.\n");
    fclose(infile);
    return false;
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberofcorners = 4;  // Default read 4 nodes per element.
  } else {
    numberofcorners = (int) strtol(stringptr, &stringptr, 0);
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberoftetrahedronattributes = 0; // Default no attribute.
  } else {
    numberoftetrahedronattributes = (int) strtol(stringptr, &stringptr, 0);
  }
  if (numberofcorners != 4 && numberofcorners != 10) {
    printf("Error:  Wrong number of corners %d (should be 4 or 10).\n", 
           numberofcorners);
    fclose(infile);
    return false;
  }

  // Allocate memory for tetrahedra.
  tetrahedronlist = new int[numberoftetrahedra * numberofcorners]; 
  if (tetrahedronlist == (int *) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Allocate memory for output tetrahedron attributes if necessary.
  if (numberoftetrahedronattributes > 0) {
    tetrahedronattributelist = new REAL[numberoftetrahedra *
                                        numberoftetrahedronattributes];
    if (tetrahedronattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the list of tetrahedra.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberoftetrahedra; i++) {
    // Read tetrahedron index and the tetrahedron's corners.
    stringptr = readnumberline(inputline, infile, infilename);
    for (j = 0; j < numberofcorners; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
               i + firstnumber, j + 1, infilename);
        terminatetetgen(NULL, 1);
      }
      corner = (int) strtol(stringptr, &stringptr, 0);
      if (corner < firstnumber || corner >= numberofpoints + firstnumber) {
        printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
               i + firstnumber);
        terminatetetgen(NULL, 1);
      }
      tetrahedronlist[index++] = corner;
    }
    // Read the tetrahedron's attributes.
    for (j = 0; j < numberoftetrahedronattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      tetrahedronattributelist[attribindex++] = attrib;
    }
  }

  fclose(infile);

  return true;
}